

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O1

void tcg_gen_stl_vec_m68k
               (TCGContext_conflict2 *tcg_ctx,TCGv_vec r,TCGv_ptr b,TCGArg o,
               TCGType_conflict low_type)

{
  TCGOp *pTVar1;
  uintptr_t o_1;
  uintptr_t o_2;
  
  pTVar1 = tcg_emit_op_m68k(tcg_ctx,INDEX_op_st_vec);
  pTVar1->field_0x1 = (byte)(low_type * 0x100 + 0xe00 >> 8) & 0xf;
  pTVar1->args[0] = (TCGArg)(r + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(b + (long)tcg_ctx);
  pTVar1->args[2] = o;
  return;
}

Assistant:

void tcg_gen_stl_vec(TCGContext *tcg_ctx, TCGv_vec r, TCGv_ptr b, TCGArg o, TCGType low_type)
{
    TCGArg ri = tcgv_vec_arg(tcg_ctx, r);
    TCGArg bi = tcgv_ptr_arg(tcg_ctx, b);
    TCGTemp *rt = arg_temp(ri);
    TCGType type = rt->base_type;

    tcg_debug_assert(low_type >= TCG_TYPE_V64);
    tcg_debug_assert(low_type <= type);
    vec_gen_3(tcg_ctx, INDEX_op_st_vec, low_type, 0, ri, bi, o);
}